

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instance.cpp
# Opt level: O1

string * __thiscall
FloatInstance::op_isEqualTo
          (string *__return_storage_ptr__,FloatInstance *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *arguments)

{
  string *str;
  bool bVar1;
  undefined8 *puVar2;
  char *pcVar3;
  __shared_ptr<FloatInstance,(__gnu_cxx::_Lock_policy)2> *this_00;
  undefined1 local_49;
  FloatInstance *local_48;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_40;
  shared_ptr<Instance> local_38;
  shared_ptr<Instance> local_28;
  
  str = (arguments->
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )._M_impl.super__Vector_impl_data._M_start;
  if ((long)(arguments->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_finish - (long)str == 0x20) {
    bVar1 = Grammar::is_float_value(str);
    if (bVar1) {
      std::__shared_ptr<Instance,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<Instance,void>
                ((__shared_ptr<Instance,(__gnu_cxx::_Lock_policy)2> *)&local_38,
                 (__weak_ptr<Instance,_(__gnu_cxx::_Lock_policy)2> *)
                 &(this->super_Instance).super_enable_shared_from_this<Instance>);
      local_48 = (FloatInstance *)0x0;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<FloatInstance,std::allocator<FloatInstance>,std::__cxx11::string_const&>
                (&_Stack_40,&local_48,(allocator<FloatInstance> *)&local_49,
                 (arguments->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start);
      this_00 = (__shared_ptr<FloatInstance,(__gnu_cxx::_Lock_policy)2> *)&local_48;
      std::__shared_ptr<FloatInstance,(__gnu_cxx::_Lock_policy)2>::
      _M_enable_shared_from_this_with<FloatInstance,FloatInstance>(this_00,local_48);
      local_28.super___shared_ptr<Instance,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           &local_48->super_Instance;
      local_28.super___shared_ptr<Instance,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           _Stack_40._M_pi;
      local_48 = (FloatInstance *)0x0;
      _Stack_40._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      bVar1 = InstanceIsEqualToComparator::operator()
                        ((InstanceIsEqualToComparator *)this_00,&local_38,&local_28);
      pcVar3 = "false";
      if (bVar1) {
        pcVar3 = "true";
      }
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)__return_storage_ptr__,pcVar3,pcVar3 + ((ulong)bVar1 ^ 5));
      if (local_28.super___shared_ptr<Instance,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_28.super___shared_ptr<Instance,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                   _M_pi);
      }
      if (_Stack_40._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_40._M_pi);
      }
      if (local_38.super___shared_ptr<Instance,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_38.super___shared_ptr<Instance,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                   _M_pi);
      }
      return __return_storage_ptr__;
    }
    puVar2 = (undefined8 *)__cxa_allocate_exception(8);
    pcVar3 = "RuntimeError: invalid argument.";
  }
  else {
    puVar2 = (undefined8 *)__cxa_allocate_exception(8);
    pcVar3 = "RuntimeError: wrong number of arguments.";
  }
  *puVar2 = pcVar3;
  __cxa_throw(puVar2,&char_const*::typeinfo,0);
}

Assistant:

std::string FloatInstance::op_isEqualTo(const std::vector<std::string>& arguments) {
    if (arguments.size() != 1)
        throw EXC_WRONG_NUMBER_OF_ARGUMENTS;
    if (!Grammar::is_float_value(arguments[0]))
        throw EXC_INVALID_ARGUMENT;
    return InstanceIsEqualToComparator()(shared_from_this(), std::make_shared<FloatInstance>(arguments[0])) ?
           "true" : "false";
}